

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# INTEGER.c
# Opt level: O2

asn_dec_rval_t
INTEGER_decode_uper(asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,
                   asn_per_constraints_t *constraints,void **sptr,asn_per_data_t *pd)

{
  asn_per_constraint_flags aVar1;
  uint uVar2;
  int32_t iVar3;
  int iVar4;
  INTEGER_t *st;
  uint8_t *puVar5;
  ssize_t sVar6;
  ulong uVar7;
  asn_dec_rval_t aVar8;
  ulong uStack_50;
  unsigned_long uvalue;
  int repeat;
  void *local_38;
  
  local_38 = td->specifics;
  st = (INTEGER_t *)*sptr;
  uStack_50 = 2;
  if (st == (INTEGER_t *)0x0) {
    st = (INTEGER_t *)calloc(1,0x10);
    *sptr = st;
    if (st == (INTEGER_t *)0x0) goto LAB_0013ff92;
  }
  if ((constraints == (asn_per_constraints_t *)0x0) &&
     (constraints = td->per_constraints, constraints == (asn_per_constraints_t *)0x0)) {
    constraints = (asn_per_constraints_t *)0x0;
  }
  else if (((constraints->value).flags & APC_EXTENSIBLE) != APC_UNCONSTRAINED) {
    iVar3 = per_get_few_bits(pd,1);
    if (iVar3 != 0) {
      constraints = (asn_per_constraints_t *)0x0;
    }
    if (iVar3 < 0) {
LAB_0013ff90:
      uStack_50 = 1;
      goto LAB_0013ff92;
    }
  }
  free(st->buf);
  st->buf = (uint8_t *)0x0;
  st->size = 0;
  if (constraints == (asn_per_constraints_t *)0x0) {
LAB_0013ff7b:
    do {
      sVar6 = uper_get_length(pd,-1,&repeat);
      if (sVar6 < 0) goto LAB_0013ff90;
      puVar5 = (uint8_t *)realloc(st->buf,st->size + sVar6 + 1);
      if (puVar5 == (uint8_t *)0x0) goto LAB_0013ff92;
      st->buf = puVar5;
      iVar4 = per_get_many_bits(pd,puVar5 + st->size,0,(int)sVar6 * 8);
      if (iVar4 < 0) goto LAB_0013ff90;
      iVar4 = (int)sVar6 + st->size;
      st->size = iVar4;
    } while (repeat != 0);
    st->buf[iVar4] = '\0';
    if (((constraints != (asn_per_constraints_t *)0x0) && ((constraints->value).lower_bound != 0))
       && ((iVar4 = asn_INTEGER2long(st,(long *)&uvalue), iVar4 != 0 ||
           (iVar4 = asn_long2INTEGER(st,(constraints->value).lower_bound + uvalue), iVar4 != 0))))
    goto LAB_0013ff92;
  }
  else {
    aVar1 = (constraints->value).flags;
    if ((aVar1 & APC_SEMI_CONSTRAINED) == APC_UNCONSTRAINED) {
      if ((aVar1 & APC_CONSTRAINED) == APC_UNCONSTRAINED) {
        if (aVar1 == APC_UNCONSTRAINED) goto LAB_0013ff7b;
      }
      else {
        uVar2 = (constraints->value).range_bits;
        if (-1 < (int)uVar2) {
          uVar7 = (ulong)uVar2 + 7 >> 3;
          puVar5 = (uint8_t *)malloc(uVar7 + 2);
          st->buf = puVar5;
          if (puVar5 == (uint8_t *)0x0) goto LAB_0013ff92;
          goto LAB_0013fed4;
        }
      }
    }
    else {
      puVar5 = (uint8_t *)calloc(1,2);
      st->buf = puVar5;
      if (puVar5 == (uint8_t *)0x0) goto LAB_0013ff92;
      uVar7 = 1;
LAB_0013fed4:
      st->size = (int)uVar7;
    }
    uVar2 = (constraints->value).range_bits;
    if ((int)uVar2 < 0) goto LAB_0013ff7b;
    if (0x40 < uVar2) goto LAB_0013ff92;
    if ((local_38 == (void *)0x0) || (*(int *)((long)local_38 + 0x20) == 0)) {
      iVar4 = uper_get_constrained_whole_number(pd,&uvalue,uVar2);
      if (iVar4 != 0) {
LAB_0013ffef:
        uStack_50 = 1;
        goto LAB_0013ff92;
      }
      uvalue = uvalue + (constraints->value).lower_bound;
      iVar4 = asn_long2INTEGER(st,uvalue);
    }
    else {
      iVar4 = uper_get_constrained_whole_number(pd,&uvalue,uVar2);
      if (iVar4 != 0) goto LAB_0013ffef;
      uvalue = uvalue + (constraints->value).lower_bound;
      iVar4 = asn_ulong2INTEGER(st,uvalue);
    }
    if (iVar4 != 0) {
      uStack_50 = 2;
      goto LAB_0013ff92;
    }
  }
  uStack_50 = 0;
LAB_0013ff92:
  aVar8.consumed = 0;
  aVar8._0_8_ = uStack_50;
  return aVar8;
}

Assistant:

asn_dec_rval_t
INTEGER_decode_uper(asn_codec_ctx_t *opt_codec_ctx, asn_TYPE_descriptor_t *td,
	asn_per_constraints_t *constraints, void **sptr, asn_per_data_t *pd) {
	asn_INTEGER_specifics_t *specs=(asn_INTEGER_specifics_t *)td->specifics;
	asn_dec_rval_t rval = { RC_OK, 0 };
	INTEGER_t *st = (INTEGER_t *)*sptr;
	asn_per_constraint_t *ct;
	int repeat;

	(void)opt_codec_ctx;

	if(!st) {
		st = (INTEGER_t *)(*sptr = CALLOC(1, sizeof(*st)));
		if(!st) ASN__DECODE_FAILED;
	}

	if(!constraints) constraints = td->per_constraints;
	ct = constraints ? &constraints->value : 0;

	if(ct && ct->flags & APC_EXTENSIBLE) {
		int inext = per_get_few_bits(pd, 1);
		if(inext < 0) ASN__DECODE_STARVED;
		if(inext) ct = 0;
	}

	FREEMEM(st->buf);
	st->buf = 0;
	st->size = 0;
	if(ct) {
		if(ct->flags & APC_SEMI_CONSTRAINED) {
			st->buf = (uint8_t *)CALLOC(1, 2);
			if(!st->buf) ASN__DECODE_FAILED;
			st->size = 1;
		} else if(ct->flags & APC_CONSTRAINED && ct->range_bits >= 0) {
			size_t size = (ct->range_bits + 7) >> 3;
			st->buf = (uint8_t *)MALLOC(1 + size + 1);
			if(!st->buf) ASN__DECODE_FAILED;
			st->size = size;
		}
	}

	/* X.691-2008/11, #13.2.2, constrained whole number */
	if(ct && ct->flags != APC_UNCONSTRAINED) {
		/* #11.5.6 */
		ASN_DEBUG("Integer with range %d bits", ct->range_bits);
		if(ct->range_bits >= 0) {
			if((size_t)ct->range_bits > 8 * sizeof(unsigned long))
				ASN__DECODE_FAILED;

			if(specs && specs->field_unsigned) {
				unsigned long uvalue;
				if(uper_get_constrained_whole_number(pd,
					&uvalue, ct->range_bits))
					ASN__DECODE_STARVED;
				ASN_DEBUG("Got value %lu + low %ld",
					uvalue, ct->lower_bound);
				uvalue += ct->lower_bound;
				if(asn_ulong2INTEGER(st, uvalue))
					ASN__DECODE_FAILED;
			} else {
				unsigned long svalue;
				if(uper_get_constrained_whole_number(pd,
					&svalue, ct->range_bits))
					ASN__DECODE_STARVED;
				ASN_DEBUG("Got value %ld + low %ld",
					svalue, ct->lower_bound);
				svalue += ct->lower_bound;
				if(asn_long2INTEGER(st, svalue))
					ASN__DECODE_FAILED;
			}
			return rval;
		}
	} else {
		ASN_DEBUG("Decoding unconstrained integer %s", td->name);
	}

	/* X.691, #12.2.3, #12.2.4 */
	do {
		ssize_t len;
		void *p;
		int ret;

		/* Get the PER length */
		len = uper_get_length(pd, -1, &repeat);
		if(len < 0) ASN__DECODE_STARVED;

		p = REALLOC(st->buf, st->size + len + 1);
		if(!p) ASN__DECODE_FAILED;
		st->buf = (uint8_t *)p;

		ret = per_get_many_bits(pd, &st->buf[st->size], 0, 8 * len);
		if(ret < 0) ASN__DECODE_STARVED;
		st->size += len;
	} while(repeat);
	st->buf[st->size] = 0;	/* JIC */

	/* #12.2.3 */
	if(ct && ct->lower_bound) {
		/*
		 * TODO: replace by in-place arithmetics.
		 */
		long value;
		if(asn_INTEGER2long(st, &value))
			ASN__DECODE_FAILED;
		if(asn_long2INTEGER(st, value + ct->lower_bound))
			ASN__DECODE_FAILED;
	}

	return rval;
}